

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toupper.c
# Opt level: O3

int main(void)

{
  __int32_t **pp_Var1;
  __int32_t *p_Var2;
  
  pp_Var1 = __ctype_toupper_loc();
  p_Var2 = *pp_Var1;
  if (p_Var2[0x61] != 0x41) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/toupper.c, line %d - %s\n"
           ,0x1a,"toupper( \'a\' ) == \'A\'");
    p_Var2 = *pp_Var1;
  }
  if (p_Var2[0x7a] != 0x5a) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/toupper.c, line %d - %s\n"
           ,0x1b,"toupper( \'z\' ) == \'Z\'");
    p_Var2 = *pp_Var1;
  }
  if (p_Var2[0x41] != 0x41) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/toupper.c, line %d - %s\n"
           ,0x1c,"toupper( \'A\' ) == \'A\'");
    p_Var2 = *pp_Var1;
  }
  if (p_Var2[0x5a] != 0x5a) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/toupper.c, line %d - %s\n"
           ,0x1d,"toupper( \'Z\' ) == \'Z\'");
    p_Var2 = *pp_Var1;
  }
  if (p_Var2[0x40] != 0x40) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/toupper.c, line %d - %s\n"
           ,0x1e,"toupper( \'@\' ) == \'@\'");
    p_Var2 = *pp_Var1;
  }
  if (p_Var2[0x5b] != 0x5b) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/toupper.c, line %d - %s\n"
           ,0x1f,"toupper( \'[\' ) == \'[\'");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    TESTCASE( toupper( 'a' ) == 'A' );
    TESTCASE( toupper( 'z' ) == 'Z' );
    TESTCASE( toupper( 'A' ) == 'A' );
    TESTCASE( toupper( 'Z' ) == 'Z' );
    TESTCASE( toupper( '@' ) == '@' );
    TESTCASE( toupper( '[' ) == '[' );
    return TEST_RESULTS;
}